

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O0

Own<capnp::EzRpcServer::Impl> __thiscall
kj::
heap<capnp::EzRpcServer::Impl,capnp::Capability::Client,kj::StringPtr&,unsigned_int&,capnp::ReaderOptions&>
          (kj *this,Client *params,StringPtr *params_1,uint *params_2,ReaderOptions *params_3)

{
  uint defaultPort;
  ArrayPtr<const_char> bindAddress;
  Impl *this_00;
  Client *pCVar1;
  ArrayPtr<const_char> *pAVar2;
  uint *puVar3;
  ReaderOptions *pRVar4;
  Impl *extraout_RDX;
  Own<capnp::EzRpcServer::Impl> OVar5;
  Client local_40;
  ReaderOptions *local_30;
  ReaderOptions *params_local_3;
  uint *params_local_2;
  StringPtr *params_local_1;
  Client *params_local;
  
  local_30 = params_3;
  params_local_3 = (ReaderOptions *)params_2;
  params_local_2 = (uint *)params_1;
  params_local_1 = (StringPtr *)params;
  params_local = (Client *)this;
  this_00 = (Impl *)operator_new(0x98);
  pCVar1 = fwd<capnp::Capability::Client>((NoInfer<capnp::Capability::Client> *)params_local_1);
  capnp::Capability::Client::Client(&local_40,pCVar1);
  pAVar2 = &fwd<kj::StringPtr&>((StringPtr *)params_local_2)->content;
  bindAddress = *pAVar2;
  puVar3 = fwd<unsigned_int&>((uint *)params_local_3);
  defaultPort = *puVar3;
  pRVar4 = fwd<capnp::ReaderOptions&>(local_30);
  capnp::EzRpcServer::Impl::Impl(this_00,&local_40,(StringPtr)bindAddress,defaultPort,*pRVar4);
  Own<capnp::EzRpcServer::Impl>::Own
            ((Own<capnp::EzRpcServer::Impl> *)this,this_00,
             (Disposer *)&_::HeapDisposer<capnp::EzRpcServer::Impl>::instance);
  capnp::Capability::Client::~Client(&local_40);
  OVar5.ptr = extraout_RDX;
  OVar5.disposer = (Disposer *)this;
  return OVar5;
}

Assistant:

Own<T> heap(Params&&... params) {
  // heap<T>(...) allocates a T on the heap, forwarding the parameters to its constructor.  The
  // exact heap implementation is unspecified -- for now it is operator new, but you should not
  // assume this.  (Since we know the object size at delete time, we could actually implement an
  // allocator that is more efficient than operator new.)

  return Own<T>(new T(kj::fwd<Params>(params)...), _::HeapDisposer<T>::instance);
}